

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O3

string * __thiscall
BlurayHelper::ssifFileName_abi_cxx11_(string *__return_storage_ptr__,BlurayHelper *this,int num)

{
  size_type *psVar1;
  pointer pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  undefined8 uVar7;
  ulong uVar8;
  string prefix;
  int local_1f4;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ulong *local_190;
  long local_188;
  ulong local_180 [2];
  ulong *local_170;
  long local_168;
  ulong local_160 [2];
  long *local_150;
  ulong local_148;
  long local_140;
  undefined8 uStack_138;
  long *local_130;
  ulong local_128;
  long local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  string local_d0;
  long *local_b0;
  ulong local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_1f4 = num;
  local_90[0] = local_80;
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    pcVar2 = (this->m_dstPath)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar2,pcVar2 + (this->m_dstPath)._M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
  }
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    getDirSeparator();
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"BDMV","");
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,(ulong)local_90[0]);
  local_b0 = &local_a0;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar3[3];
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b0,local_a8,0,'\x01');
  local_1f0 = &local_1e0;
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_1e0 = *puVar6;
    uStack_1d8 = (undefined4)plVar3[3];
    uStack_1d4 = *(undefined4 *)((long)plVar3 + 0x1c);
  }
  else {
    local_1e0 = *puVar6;
    local_1f0 = (ulong *)*plVar3;
  }
  local_1e8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"STREAM","");
  uVar8 = 0xf;
  if (local_1f0 != &local_1e0) {
    uVar8 = local_1e0;
  }
  if (uVar8 < (ulong)(local_168 + local_1e8)) {
    uVar8 = 0xf;
    if (local_170 != local_160) {
      uVar8 = local_160[0];
    }
    if (uVar8 < (ulong)(local_168 + local_1e8)) goto LAB_0017b764;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_1f0);
  }
  else {
LAB_0017b764:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_170);
  }
  local_150 = &local_140;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_140 = *plVar3;
    uStack_138 = puVar4[3];
  }
  else {
    local_140 = *plVar3;
    local_150 = (long *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_150,local_148,0,'\x01');
  local_1d0 = &local_1c0;
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_1c0 = *puVar6;
    uStack_1b8 = (undefined4)plVar3[3];
    uStack_1b4 = *(undefined4 *)((long)plVar3 + 0x1c);
  }
  else {
    local_1c0 = *puVar6;
    local_1d0 = (ulong *)*plVar3;
  }
  local_1c8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"SSIF","");
  uVar8 = 0xf;
  if (local_1d0 != &local_1c0) {
    uVar8 = local_1c0;
  }
  if (uVar8 < (ulong)(local_188 + local_1c8)) {
    uVar8 = 0xf;
    if (local_190 != local_180) {
      uVar8 = local_180[0];
    }
    if (uVar8 < (ulong)(local_188 + local_1c8)) goto LAB_0017b89f;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_1d0);
  }
  else {
LAB_0017b89f:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_190);
  }
  local_130 = &local_120;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_120 = *plVar3;
    uStack_118 = puVar4[3];
  }
  else {
    local_120 = *plVar3;
    local_130 = (long *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_130,local_128,0,'\x01');
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_100 = *puVar6;
    lStack_f8 = plVar3[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar6;
    local_110 = (ulong *)*plVar3;
  }
  local_108 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  int32ToStr_abi_cxx11_(&local_50,&local_1f4);
  strPadLeft(&local_d0,&local_50,5,'0');
  uVar8 = 0xf;
  if (local_110 != &local_100) {
    uVar8 = local_100;
  }
  if (uVar8 < local_d0._M_string_length + local_108) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar7 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_d0._M_string_length + local_108) goto LAB_0017ba04;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0017ba04:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_d0._M_dataplus._M_p);
  }
  local_1b0 = &local_1a0;
  puVar6 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar6) {
    local_1a0 = *puVar6;
    uStack_198 = *(undefined4 *)(puVar4 + 3);
    uStack_194 = *(undefined4 *)((long)puVar4 + 0x1c);
  }
  else {
    local_1a0 = *puVar6;
    local_1b0 = (ulong *)*puVar4;
  }
  local_1a8 = puVar4[1];
  *puVar4 = puVar6;
  puVar4[1] = 0;
  *(undefined1 *)puVar6 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,".ssif","");
  uVar8 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar8 = local_1a0;
  }
  if (uVar8 < (ulong)(local_e8 + local_1a8)) {
    uVar8 = 0xf;
    if (local_f0 != local_e0) {
      uVar8 = local_e0[0];
    }
    if ((ulong)(local_e8 + local_1a8) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_1b0);
      goto LAB_0017bafb;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_f0);
LAB_0017bafb:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar7 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_190 != local_180) {
    operator_delete(local_190,local_180[0] + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string BlurayHelper::ssifFileName(const int num) const
{
    const string prefix = m_isoWriter ? "" : m_dstPath;
    const char separator = m_isoWriter ? '/' : getDirSeparator();
    return prefix + string("BDMV") + separator + string("STREAM") + separator + string("SSIF") + separator +
           strPadLeft(int32ToStr(num), 5, '0') + string(".ssif");
}